

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O0

size_t x86_code(lzma_simple *simple,uint32_t now_pos,_Bool is_encoder,uint8_t *buffer,size_t size)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint local_5c;
  uint32_t i_1;
  uint32_t dest;
  uint32_t src;
  uint8_t b;
  uint32_t i;
  uint32_t offset;
  size_t buffer_pos;
  size_t limit;
  uint32_t prev_pos;
  uint32_t prev_mask;
  size_t size_local;
  uint8_t *buffer_local;
  _Bool is_encoder_local;
  uint32_t now_pos_local;
  lzma_simple *simple_local;
  
  limit._0_4_ = simple->prev_pos;
  if (size < 5) {
    simple_local = (lzma_simple *)0x0;
  }
  else {
    if (5 < now_pos - (uint32_t)limit) {
      limit._0_4_ = now_pos - 5;
    }
    _i = (lzma_simple *)0x0;
    uVar3 = simple->prev_mask;
    while (limit._4_4_ = uVar3, _i <= (lzma_simple *)(size - 5)) {
      if ((buffer[(long)_i] == 0xe8) || (buffer[(long)_i] == 0xe9)) {
        iVar4 = (int)_i;
        uVar3 = (now_pos + iVar4) - (uint32_t)limit;
        limit._0_4_ = now_pos + iVar4;
        if (uVar3 < 6) {
          for (src = 0; src < uVar3; src = src + 1) {
            limit._4_4_ = (limit._4_4_ & 0x77) << 1;
          }
        }
        else {
          limit._4_4_ = 0;
        }
        bVar1 = (buffer + 4)[(long)_i];
        if ((((bVar1 == 0) || (bVar1 == 0xff)) &&
            ((x86_code::MASK_TO_ALLOWED_STATUS[limit._4_4_ >> 1 & 7] & 1U) != 0)) &&
           (limit._4_4_ >> 1 < 0x10)) {
          i_1 = (uint)bVar1 << 0x18 | (uint)(buffer + 3)[(long)_i] << 0x10 |
                (uint)(buffer + 2)[(long)_i] << 8 | (uint)(buffer + 1)[(long)_i];
          while( true ) {
            if (is_encoder) {
              iVar5 = now_pos + iVar4 + 5;
            }
            else {
              iVar5 = -(now_pos + iVar4 + 5);
            }
            local_5c = i_1 + iVar5;
            if (limit._4_4_ == 0) break;
            cVar2 = (char)(local_5c >>
                          (0x18U - (char)(x86_code::MASK_TO_BIT_NUMBER[limit._4_4_ >> 1] << 3) &
                          0x1f));
            if ((cVar2 != '\0') && (cVar2 != -1)) break;
            i_1 = local_5c ^
                  (1 << (0x20U - (char)(x86_code::MASK_TO_BIT_NUMBER[limit._4_4_ >> 1] << 3) & 0x1f)
                  ) - 1U;
          }
          (buffer + 4)[(long)_i] = ((byte)(local_5c >> 0x18) & 1) - 1 ^ 0xff;
          (buffer + 3)[(long)_i] = (uint8_t)(local_5c >> 0x10);
          (buffer + 2)[(long)_i] = (uint8_t)(local_5c >> 8);
          (buffer + 1)[(long)_i] = (uint8_t)local_5c;
          _i = (lzma_simple *)((long)&_i->prev_pos + 1);
          limit._4_4_ = 0;
          uVar3 = limit._4_4_;
        }
        else {
          _i = (lzma_simple *)((long)&_i->prev_mask + 1);
          if ((bVar1 == 0) || (uVar3 = limit._4_4_ | 1, bVar1 == 0xff)) {
            uVar3 = limit._4_4_ | 0x11;
          }
        }
      }
      else {
        _i = (lzma_simple *)((long)&_i->prev_mask + 1);
        uVar3 = limit._4_4_;
      }
    }
    simple->prev_mask = limit._4_4_;
    simple->prev_pos = (uint32_t)limit;
    simple_local = _i;
  }
  return (size_t)simple_local;
}

Assistant:

static size_t
x86_code(lzma_simple *simple, uint32_t now_pos, bool is_encoder,
		uint8_t *buffer, size_t size)
{
	static const bool MASK_TO_ALLOWED_STATUS[8]
		= { true, true, true, false, true, false, false, false };

	static const uint32_t MASK_TO_BIT_NUMBER[8]
			= { 0, 1, 2, 2, 3, 3, 3, 3 };

	uint32_t prev_mask = simple->prev_mask;
	uint32_t prev_pos = simple->prev_pos;

	size_t limit;
	size_t buffer_pos;

	if (size < 5)
		return 0;

	if (now_pos - prev_pos > 5)
		prev_pos = now_pos - 5;

	limit = size - 5;
	buffer_pos = 0;

	while (buffer_pos <= limit) {
		uint32_t offset;
		uint32_t i;

		uint8_t b = buffer[buffer_pos];
		if (b != 0xE8 && b != 0xE9) {
			++buffer_pos;
			continue;
		}

		offset = now_pos + (uint32_t)(buffer_pos)
				- prev_pos;
		prev_pos = now_pos + (uint32_t)(buffer_pos);

		if (offset > 5) {
			prev_mask = 0;
		} else {
			for (i = 0; i < offset; ++i) {
				prev_mask &= 0x77;
				prev_mask <<= 1;
			}
		}

		b = buffer[buffer_pos + 4];

		if (Test86MSByte(b)
			&& MASK_TO_ALLOWED_STATUS[(prev_mask >> 1) & 0x7]
				&& (prev_mask >> 1) < 0x10) {

			uint32_t src = ((uint32_t)(b) << 24)
				| ((uint32_t)(buffer[buffer_pos + 3]) << 16)
				| ((uint32_t)(buffer[buffer_pos + 2]) << 8)
				| (buffer[buffer_pos + 1]);

			uint32_t dest;
			while (true) {
				uint32_t i;

				if (is_encoder)
					dest = src + (now_pos + (uint32_t)(
							buffer_pos) + 5);
				else
					dest = src - (now_pos + (uint32_t)(
							buffer_pos) + 5);

				if (prev_mask == 0)
					break;

				i = MASK_TO_BIT_NUMBER[prev_mask >> 1];

				b = (uint8_t)(dest >> (24 - i * 8));

				if (!Test86MSByte(b))
					break;

				src = dest ^ ((1 << (32 - i * 8)) - 1);
			}

			buffer[buffer_pos + 4]
					= (uint8_t)(~(((dest >> 24) & 1) - 1));
			buffer[buffer_pos + 3] = (uint8_t)(dest >> 16);
			buffer[buffer_pos + 2] = (uint8_t)(dest >> 8);
			buffer[buffer_pos + 1] = (uint8_t)(dest);
			buffer_pos += 5;
			prev_mask = 0;

		} else {
			++buffer_pos;
			prev_mask |= 1;
			if (Test86MSByte(b))
				prev_mask |= 0x10;
		}
	}

	simple->prev_mask = prev_mask;
	simple->prev_pos = prev_pos;

	return buffer_pos;
}